

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

LPWSTR LOADGetModuleFileName(MODSTRUCT *module)

{
  if (module == (MODSTRUCT *)0x0) {
    if (PAL_InitializeChakraCoreCalled) {
      module = &exe_module;
      goto LAB_003343f0;
    }
  }
  else if (PAL_InitializeChakraCoreCalled) {
LAB_003343f0:
    return module->lib_name;
  }
  abort();
}

Assistant:

static LPWSTR LOADGetModuleFileName(MODSTRUCT *module)
{
    LPWSTR module_name;
    /* special case : if module is NULL, we want the name of the executable */
    if (!module)
    {
        module_name = exe_module.lib_name;
        TRACE("Returning name of main executable\n");
        return module_name;
    }

    /* return "real" name of module if it is known. we have this if LoadLibrary
       was given an absolute or relative path; we can also determine it at the
       first GetProcAddress call. */
    TRACE("Returning full path name of module\n");
    return module->lib_name;
}